

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

bool __thiscall
Liby::http::RequestParser::ParseHttpVersion(RequestParser *this,char *begin,char *end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (((end == (char *)0x0) || (begin == (char *)0x0)) || (end < begin)) {
    __assert_fail("begin <= end && begin && end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                  ,0xbc,
                  "bool Liby::http::RequestParser::ParseHttpVersion(const char *, const char *)");
  }
  iVar3 = 8;
  if ((int)end - (int)begin == 8) {
    iVar1 = strncmp("HTTP/1.1",begin,8);
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar2 = strncmp("HTTP/1.0",begin,8);
      iVar1 = 0;
      if (iVar2 != 0) goto LAB_00118b0c;
    }
    this->http_version_major_ = 1;
    this->http_version_minor_ = iVar1;
    iVar1 = 1;
    iVar3 = 4;
  }
  else {
    iVar1 = 0;
  }
LAB_00118b0c:
  this->progress_ = iVar3;
  return SUB41(iVar1,0);
}

Assistant:

bool RequestParser::ParseHttpVersion(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    int length = end - begin;
    if (length != 8) {
        progress_ = InvalidVersion;
        return false;
    }
    if (!std::strncmp("HTTP/1.1", begin, 8)) {
        http_version_major_ = 1;
        http_version_minor_ = 1;
    } else if (!std::strncmp("HTTP/1.0", begin, 8)) {
        http_version_major_ = 1;
        http_version_minor_ = 0;
    } else {
        progress_ = InvalidVersion;
        return false;
    }
    progress_ = ParsingHeaders;
    return true;
}